

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O0

monitor * monitor_create(uint32_t id,xcb_rectangle_t rect,workspace *workspace)

{
  monitor *monitor;
  workspace *workspace_local;
  uint32_t id_local;
  xcb_rectangle_t rect_local;
  
  rect_local = (xcb_rectangle_t)malloc(0x20);
  if (rect_local == (xcb_rectangle_t)0x0) {
    rect_local.x = 0;
    rect_local.y = 0;
    rect_local.width = 0;
    rect_local.height = 0;
  }
  else {
    *(uint32_t *)rect_local = id;
    *(xcb_rectangle_t *)((long)rect_local + 4) = rect;
    *(workspace **)((long)rect_local + 0x18) = workspace;
  }
  return (monitor *)rect_local;
}

Assistant:

struct monitor *monitor_create(uint32_t id, xcb_rectangle_t rect, struct workspace *workspace)
{
        struct monitor *monitor = malloc(sizeof(struct monitor));

        if (monitor == NULL) {
                return NULL;
        }

        monitor->id = id;
        monitor->rect = rect;
        monitor->workspace = workspace;

        return monitor;
}